

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O0

Error asmjit::X86RAPass_translateOperands(X86RAPass *self,Operand_ *opArray,uint32_t opCount)

{
  RAPass *pRVar1;
  long lVar2;
  uint *puVar3;
  CBNode *pCVar4;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  bool bVar5;
  VirtReg *vreg_2;
  VirtReg *vreg_1;
  X86Mem *m;
  VirtReg *vreg;
  Operand_ *op;
  uint32_t i;
  X86Compiler *cc;
  size_t index_4;
  size_t index_2;
  size_t index;
  size_t index_3;
  size_t index_1;
  char *in_stack_00000170;
  int in_stack_0000017c;
  char *in_stack_00000180;
  RACell *cell;
  VirtReg *in_stack_fffffffffffffda0;
  RAPass *in_stack_fffffffffffffda8;
  uint local_214;
  
  pRVar1 = *(RAPass **)(in_RDI + 8);
  local_214 = 0;
  do {
    if (in_EDX <= local_214) {
      return 0;
    }
    puVar3 = (uint *)(in_RSI + (ulong)local_214 * 0x10);
    bVar5 = false;
    if ((*puVar3 & 7) == 1) {
      bVar5 = puVar3[1] - 0x100 < 0xffffff00;
    }
    if (bVar5) {
      if (puVar3[1] == 0xffffffff) {
        DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
      }
      pCVar4 = (CBNode *)(ulong)(puVar3[1] - 0x100);
      if (pRVar1[1]._stop <= pCVar4) {
        DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
      }
      in_stack_fffffffffffffda0 = (VirtReg *)&pRVar1[1]._func;
      if (pRVar1[1]._stop <= pCVar4) {
        DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
      }
      lVar2 = *(long *)((*(CCFunc **)in_stack_fffffffffffffda0)->_funcDetail)._callConv._passedOrder
                       [(long)&pCVar4[-1]._passData].id;
      if (lVar2 == 0) {
        DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
      }
      if (*(char *)(lVar2 + 0x25) == -1) {
        DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
      }
      puVar3[1] = (uint)*(byte *)(lVar2 + 0x25);
      in_stack_fffffffffffffda8 = pRVar1;
    }
    else if ((*puVar3 & 7) == 2) {
      if ((8 < (*puVar3 & 0xf8)) && ((CBNode *)(ulong)(puVar3[3] - 0x100) < pRVar1[1]._stop)) {
        if (puVar3[3] == 0xffffffff) {
          DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        pCVar4 = (CBNode *)(ulong)(puVar3[3] - 0x100);
        if (pRVar1[1]._stop <= pCVar4) {
          DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        if (pRVar1[1]._stop <= pCVar4) {
          DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        lVar2 = *(long *)((pRVar1[1]._func)->_funcDetail)._callConv._passedOrder
                         [(long)&pCVar4[-1]._passData].id;
        if ((*puVar3 & 0x10000) == 0) {
          if (*(char *)(lVar2 + 0x25) == -1) {
            DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
          }
          puVar3[3] = (uint)*(byte *)(lVar2 + 0x25);
        }
        else if (*(long *)(lVar2 + 0x28) == 0) {
          RAPass::_newVarCell(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        }
      }
      if ((0x100 < (*puVar3 & 0x1f00)) && ((CBNode *)(ulong)(puVar3[1] - 0x100) < pRVar1[1]._stop))
      {
        if (puVar3[1] == 0xffffffff) {
          DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        pCVar4 = (CBNode *)(ulong)(puVar3[1] - 0x100);
        if (pRVar1[1]._stop <= pCVar4) {
          DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        if (pRVar1[1]._stop <= pCVar4) {
          DebugUtils::assertionFailed(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        puVar3[1] = (uint)*(byte *)((long)((pRVar1[1]._func)->_funcDetail)._callConv._passedOrder
                                          [(long)&pCVar4[-1]._passData] + 0x25);
      }
    }
    local_214 = local_214 + 1;
  } while( true );
}

Assistant:

static Error X86RAPass_translateOperands(X86RAPass* self, Operand_* opArray, uint32_t opCount) {
  X86Compiler* cc = self->cc();

  // Translate variables into registers.
  for (uint32_t i = 0; i < opCount; i++) {
    Operand_* op = &opArray[i];
    if (op->isVirtReg()) {
      VirtReg* vreg = cc->getVirtRegById(op->getId());
      ASMJIT_ASSERT(vreg != nullptr);
      ASMJIT_ASSERT(vreg->getPhysId() != Globals::kInvalidRegId);
      op->_reg.id = vreg->getPhysId();
    }
    else if (op->isMem()) {
      X86Mem* m = static_cast<X86Mem*>(op);

      if (m->hasBaseReg() && cc->isVirtRegValid(m->getBaseId())) {
        VirtReg* vreg = cc->getVirtRegById(m->getBaseId());

        if (m->isRegHome()) {
          self->getVarCell(vreg);
        }
        else {
          ASMJIT_ASSERT(vreg->getPhysId() != Globals::kInvalidRegId);
          op->_mem.base = vreg->getPhysId();
        }
      }

      if (m->hasIndexReg() && cc->isVirtRegValid(m->getIndexId())) {
        VirtReg* vreg = cc->getVirtRegById(m->getIndexId());
        op->_mem.index = vreg->getPhysId();
      }
    }
  }

  return kErrorOk;
}